

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YuvImageProcessor.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  char *pcVar2;
  ulong uVar3;
  char *(*i_2) [3];
  char *(*__end1_2) [3];
  char *(*__begin1_2) [3];
  char *(*__range1_2) [85] [3];
  char *(*i_1) [3];
  char *(*__end1_1) [3];
  char *(*__begin1_1) [3];
  char *(*__range1_1) [85] [3];
  ofstream out;
  clock_t end_3;
  clock_t start_3;
  clock_t end_2;
  clock_t start_2;
  clock_t end_1;
  clock_t start_1;
  clock_t end;
  clock_t start;
  int interval;
  char *(*i) [3];
  char *(*__end1) [3];
  char *(*__begin1) [3];
  char *(*__range1) [85] [3];
  FILE *reader;
  char *in_stack_fffffffffffffc80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc88;
  char *(*local_348) [3];
  char **in_stack_fffffffffffffcc8;
  char *(*papcVar4) [3];
  int in_stack_fffffffffffffcd0;
  char *(*papcVar5) [3];
  char *(*local_328) [3];
  allocator local_301;
  string local_300 [32];
  string local_2e0 [32];
  string local_2c0 [32];
  string local_2a0 [32];
  char local_280 [512];
  clock_t local_80;
  clock_t local_78;
  clock_t local_70;
  clock_t local_68;
  clock_t local_60;
  clock_t local_58;
  clock_t local_50;
  clock_t local_48;
  uint local_3c;
  char *(*local_38) [3];
  char *(*local_30) [3];
  char *(*local_28) [3];
  char *(*local_20) [3];
  FILE *local_18;
  int local_4;
  
  local_4 = 0;
  bVar1 = parsePara(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  if (!bVar1) {
    printUsage();
    exit(-1);
  }
  local_18 = fopen(file_name,"r");
  local_20 = result;
  local_30 = (char *(*) [3])&_end;
  for (local_28 = result; local_28 != local_30; local_28 = local_28 + 1) {
    local_38 = local_28;
    uVar3 = (ulong)size;
    if ((long)uVar3 < 0) {
      uVar3 = 0xffffffffffffffff;
    }
    pcVar2 = (char *)operator_new__(uVar3);
    (*local_38)[0] = pcVar2;
    uVar3 = (ulong)(size / 4);
    if ((long)uVar3 < 0) {
      uVar3 = 0xffffffffffffffff;
    }
    pcVar2 = (char *)operator_new__(uVar3);
    (*local_38)[1] = pcVar2;
    uVar3 = (ulong)(size / 4);
    if ((long)uVar3 < 0) {
      uVar3 = 0xffffffffffffffff;
    }
    pcVar2 = (char *)operator_new__(uVar3);
    (*local_38)[2] = pcVar2;
  }
  fread(y,1,0x1fa400,local_18);
  fread(u,1,0x7e900,local_18);
  fread(v,1,0x7e900,local_18);
  fclose(local_18);
  if (isa == BASIC) {
    local_48 = clock();
    BasicProcessor();
    local_50 = clock();
    local_3c = (uint)(((local_50 - local_48) * 1000) / 1000000);
  }
  else if (isa == MMX) {
    local_58 = clock();
    MMXProcessor();
    local_60 = clock();
    local_3c = (uint)(((local_60 - local_58) * 1000) / 1000000);
  }
  else if (isa == SSE2) {
    local_68 = clock();
    SSE2Processor();
    local_70 = clock();
    local_3c = (uint)(((local_70 - local_68) * 1000) / 1000000);
  }
  else {
    local_78 = clock();
    AVXProcessor();
    local_80 = clock();
    local_3c = (uint)(((local_80 - local_78) * 1000) / 1000000);
  }
  printf("%s:\t%dms\n",ISAName[isa],(ulong)local_3c);
  pcVar2 = file_name;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_300,pcVar2,&local_301);
  std::operator+(in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
  std::operator+(in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
  std::operator+(in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
  std::ofstream::ofstream(local_280,local_2a0,0x10);
  std::__cxx11::string::~string(local_2a0);
  std::__cxx11::string::~string(local_2c0);
  std::__cxx11::string::~string(local_2e0);
  std::__cxx11::string::~string(local_300);
  std::allocator<char>::~allocator((allocator<char> *)&local_301);
  papcVar5 = (char *(*) [3])&_end;
  for (local_328 = result; local_328 != papcVar5; local_328 = local_328 + 1) {
    papcVar4 = local_328;
    std::ostream::write(local_280,(long)(*local_328)[0]);
    std::ostream::write(local_280,(long)(*papcVar4)[1]);
    std::ostream::write(local_280,(long)(*papcVar4)[2]);
  }
  std::ofstream::close();
  for (local_348 = result; local_348 != (char *(*) [3])&_end; local_348 = local_348 + 1) {
    if ((*local_348)[0] != (char *)0x0) {
      operator_delete((*local_348)[0]);
    }
    if ((*local_348)[1] != (char *)0x0) {
      operator_delete((*local_348)[1]);
    }
    if ((*local_348)[2] != (char *)0x0) {
      operator_delete((*local_348)[2]);
    }
  }
  std::ofstream::~ofstream(local_280);
  return local_4;
}

Assistant:

int main(int argc, char *argv[]) {
    if (!parsePara(argc, argv)) {
        printUsage();
        exit(-1);
    }

    FILE *reader = fopen(file_name, "r");

    for (auto &i : result) {
        i[0] = new char[size];
        i[1] = new char[size / 4];
        i[2] = new char[size / 4];
    }

    fread(y, 1, width * height, reader);
    fread(u, 1, width / 2 * height / 2, reader);
    fread(v, 1, width / 2 * height / 2, reader);
    fclose(reader);

    int interval;
    if (isa == BASIC) {
        auto start = clock();
        BasicProcessor();
        auto end = clock();
        interval = (end - start) * 1000 / CLOCKS_PER_SEC;
    } else if (isa == MMX) {
        auto start = clock();
        MMXProcessor();
        auto end = clock();
        interval = (end - start) * 1000 / CLOCKS_PER_SEC;
    } else if (isa == SSE2) {
        auto start = clock();
        SSE2Processor();
        auto end = clock();
        interval = (end - start) * 1000 / CLOCKS_PER_SEC;

    } else {
        auto start = clock();
        AVXProcessor();
        auto end = clock();
        interval = (end - start) * 1000 / CLOCKS_PER_SEC;
    }
    printf("%s:\t%dms\n", ISAName[isa], interval);

    std::ofstream out(std::string(file_name) + "." + ISAName[isa] + ".yuv");
    for (auto &i : result) {
        out.write(i[0], size);
        out.write(i[1], size / 4);
        out.write(i[2], size / 4);
    }
    out.close();

    for (auto &i : result) {
        delete i[0];
        delete i[1];
        delete i[2];
    }
}